

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O2

lws_tls_extant lws_tls_generic_cert_checks(lws_vhost *vhost,char *cert,char *private_key)

{
  undefined1 *puVar1;
  lws_tls_extant lVar2;
  lws_tls_extant lVar3;
  lws_tls_extant lVar4;
  
  lVar4 = LWS_TLS_EXTANT_NO;
  if (private_key != (char *)0x0 && cert != (char *)0x0) {
    lVar2 = lws_tls_use_any_upgrade_check_extant(cert);
    lVar4 = LWS_TLS_EXTANT_ALTERNATIVE;
    if (lVar2 != LWS_TLS_EXTANT_ALTERNATIVE) {
      lVar3 = lws_tls_use_any_upgrade_check_extant(private_key);
      if (lVar3 != LWS_TLS_EXTANT_ALTERNATIVE) {
        lVar4 = LWS_TLS_EXTANT_YES;
        if ((lVar2 == LWS_TLS_EXTANT_NO || lVar3 == LWS_TLS_EXTANT_NO) &&
           ((vhost->options & 0x4000000) != 0)) {
          lVar4 = LWS_TLS_EXTANT_NO;
          _lws_log(4,"Ignoring missing %s or %s\n",cert,private_key);
          puVar1 = &(vhost->tls).field_0x64;
          *puVar1 = *puVar1 | 2;
        }
      }
    }
  }
  return lVar4;
}

Assistant:

enum lws_tls_extant
lws_tls_generic_cert_checks(struct lws_vhost *vhost, const char *cert,
			    const char *private_key)
{
	int n, m;

	/*
	 * The user code can choose to either pass the cert and
	 * key filepaths using the info members like this, or it can
	 * leave them NULL; force the vhost SSL_CTX init using the info
	 * options flag LWS_SERVER_OPTION_CREATE_VHOST_SSL_CTX; and
	 * set up the cert himself using the user callback
	 * LWS_CALLBACK_OPENSSL_LOAD_EXTRA_SERVER_VERIFY_CERTS, which
	 * happened just above and has the vhost SSL_CTX * in the user
	 * parameter.
	 */

	if (!cert || !private_key)
		return LWS_TLS_EXTANT_NO;

	n = lws_tls_use_any_upgrade_check_extant(cert);
	if (n == LWS_TLS_EXTANT_ALTERNATIVE)
		return LWS_TLS_EXTANT_ALTERNATIVE;
	m = lws_tls_use_any_upgrade_check_extant(private_key);
	if (m == LWS_TLS_EXTANT_ALTERNATIVE)
		return LWS_TLS_EXTANT_ALTERNATIVE;

	if ((n == LWS_TLS_EXTANT_NO || m == LWS_TLS_EXTANT_NO) &&
	    (vhost->options & LWS_SERVER_OPTION_IGNORE_MISSING_CERT)) {
		lwsl_notice("Ignoring missing %s or %s\n", cert, private_key);
		vhost->tls.skipped_certs = 1;

		return LWS_TLS_EXTANT_NO;
	}

	/*
	 * the cert + key exist
	 */

	return LWS_TLS_EXTANT_YES;
}